

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cpp
# Opt level: O3

bool listdir(char *dirname,bool rel,char *ext,vector<char_*> *files)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  DIR *__dirp;
  dirent64 *pdVar4;
  char *__dest;
  char *pcVar5;
  string pathname;
  stringformatter local_158;
  ulong local_150;
  vector<char_*> *local_148;
  size_t local_140;
  char local_138 [264];
  
  local_148 = files;
  if (ext == (char *)0x0) {
    local_150 = 0;
  }
  else {
    sVar3 = strlen(ext);
    local_150 = (ulong)((int)sVar3 + 1);
  }
  pcVar5 = "%s";
  if (rel) {
    pcVar5 = "./%s";
  }
  local_158.buf = local_138;
  stringformatter::operator()(&local_158,pcVar5,dirname);
  __dirp = opendir(local_138);
  if (__dirp != (DIR *)0x0) {
    pdVar4 = readdir64(__dirp);
    if (pdVar4 != (dirent64 *)0x0) {
      local_140 = (size_t)((int)local_150 + -1);
      do {
        pcVar5 = pdVar4->d_name;
        if (ext == (char *)0x0) {
          sVar3 = strlen(pcVar5);
LAB_00159823:
          __dest = (char *)operator_new__(sVar3 + 1);
          strncpy(__dest,pcVar5,sVar3 + 1);
          __dest[sVar3] = '\0';
          local_158.buf = __dest;
          vector<char_*>::add(local_148,&local_158.buf);
        }
        else {
          sVar3 = strlen(pcVar5);
          uVar1 = (int)sVar3 - (int)local_150;
          if (((uVar1 != 0 && (int)local_150 <= (int)sVar3) &&
              (sVar3 = (size_t)uVar1, pcVar5[sVar3] == '.')) &&
             (iVar2 = strncmp(pcVar5 + sVar3 + 1,ext,local_140), iVar2 == 0)) goto LAB_00159823;
        }
        pdVar4 = readdir64(__dirp);
      } while (pdVar4 != (dirent64 *)0x0);
    }
    closedir(__dirp);
  }
  return __dirp != (DIR *)0x0;
}

Assistant:

bool listdir(const char *dirname, bool rel, const char *ext, vector<char *> &files)
{
    int extsize = ext ? (int)strlen(ext)+1 : 0;
    #ifdef WIN32
    defformatstring(pathname)(rel ? ".\\%s\\*.%s" : "%s\\*.%s", dirname, ext ? ext : "*");
    WIN32_FIND_DATA FindFileData;
    HANDLE Find = FindFirstFile(pathname, &FindFileData);
    if(Find != INVALID_HANDLE_VALUE)
    {
        do {
            if(!ext) files.add(newstring(FindFileData.cFileName));
            else
            {
                int namelength = (int)strlen(FindFileData.cFileName) - extsize;
                if(namelength > 0 && FindFileData.cFileName[namelength] == '.' && strncmp(FindFileData.cFileName+namelength+1, ext, extsize-1)==0)
                    files.add(newstring(FindFileData.cFileName, namelength));
            }
        } while(FindNextFile(Find, &FindFileData));
        FindClose(Find);
        return true;
    }
    #else
    defformatstring(pathname)(rel ? "./%s" : "%s", dirname);
    DIR *d = opendir(pathname);
    if(d)
    {
        struct dirent *de;
        while((de = readdir(d)) != NULL)
        {
            if(!ext) files.add(newstring(de->d_name));
            else
            {
                int namelength = (int)strlen(de->d_name) - extsize;
                if(namelength > 0 && de->d_name[namelength] == '.' && strncmp(de->d_name+namelength+1, ext, extsize-1)==0)
                    files.add(newstring(de->d_name, namelength));
            }
        }
        closedir(d);
        return true;
    }
    #endif
    else return false;
}